

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_encode.c
# Opt level: O1

void base64_encode_bs(BinarySink *bs,ptrlen input,int cpl)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  size_t i;
  long lVar4;
  ptrlen pVar5;
  char b64atom [4];
  BinarySource src [1];
  uchar local_5c [4];
  BinarySource local_58;
  
  sVar2 = input.len;
  local_58.data = input.ptr;
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  local_58.len = sVar2;
  if (sVar2 != 0) {
    sVar1 = 0;
    iVar3 = 0;
    do {
      sVar2 = sVar2 - sVar1;
      if (2 < sVar2) {
        sVar2 = 3;
      }
      pVar5 = BinarySource_get_data(local_58.binarysource_,sVar2);
      base64_encode_atom((uchar *)pVar5.ptr,(int)pVar5.len,(char *)local_5c);
      lVar4 = 0;
      do {
        if (cpl <= iVar3 && 0 < cpl) {
          BinarySink_put_byte(bs->binarysink_,'\n');
          iVar3 = 0;
        }
        BinarySink_put_byte(bs->binarysink_,local_5c[lVar4]);
        iVar3 = iVar3 + 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      sVar1 = (local_58.binarysource_)->pos;
      sVar2 = (local_58.binarysource_)->len;
    } while (sVar2 != sVar1);
  }
  if (0 < cpl) {
    BinarySink_put_byte(bs->binarysink_,'\n');
  }
  return;
}

Assistant:

void base64_encode_bs(BinarySink *bs, ptrlen input, int cpl)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, input);
    int linelen = 0;

    while (get_avail(src)) {
        size_t n = get_avail(src) < 3 ? get_avail(src) : 3;
        ptrlen binatom = get_data(src, n);

        char b64atom[4];
        base64_encode_atom(binatom.ptr, binatom.len, b64atom);
        for (size_t i = 0; i < 4; i++) {
            if (cpl > 0 && linelen >= cpl) {
                linelen = 0;
                put_byte(bs, '\n');
            }
            put_byte(bs, b64atom[i]);
            linelen++;
        }
    }
    if (cpl > 0)
        put_byte(bs, '\n');
}